

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

Aig_Man_t * Saig_ManDupInitZero(Aig_Man_t *p)

{
  char *__s;
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  Aig_Obj_t *p1;
  int iVar7;
  int iVar8;
  long lVar9;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar9 = 0;
    do {
      if (p->vCis->nSize <= lVar9) goto LAB_006ef21c;
      pvVar1 = p->vCis->pArray[lVar9];
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nTruePis);
  }
  if (0 < p->nRegs) {
    iVar7 = 0;
    do {
      uVar2 = p->nTruePis + iVar7;
      if (((int)uVar2 < 0) || (p->vCis->nSize <= (int)uVar2)) goto LAB_006ef21c;
      pvVar1 = p->vCis->pArray[uVar2];
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(ulong *)((long)pvVar1 + 0x28) =
           (ulong)(*(uint *)((long)pvVar1 + 0x18) >> 4 & 1) ^ (ulong)pAVar4;
      iVar7 = iVar7 + 1;
    } while (iVar7 < p->nRegs);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar9];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006ef23b;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar4 = Aig_And(p_00,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      }
      lVar9 = lVar9 + 1;
      pVVar5 = p->vObjs;
    } while (lVar9 < pVVar5->nSize);
  }
  if (0 < p->nTruePos) {
    lVar9 = 0;
    do {
      if (p->vCos->nSize <= lVar9) goto LAB_006ef21c;
      pvVar1 = p->vCos->pArray[lVar9];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_006ef23b;
      uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nTruePos);
  }
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    iVar8 = 0;
    do {
      uVar2 = p->nTruePos + iVar8;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
LAB_006ef21c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_006ef23b:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28);
      }
      pAVar4 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(*(uint *)((long)pvVar1 + 0x18) >> 4 & 1 ^ uVar6));
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar8 = iVar8 + 1;
      iVar7 = p->nRegs;
    } while (iVar8 < iVar7);
  }
  Aig_ManSetRegNum(p_00,iVar7);
  if (p_00->nObjs[6] + p_00->nObjs[5] == p->nObjs[6] + p->nObjs[5]) {
    return p_00;
  }
  __assert_fail("Aig_ManNodeNum(pNew) == Aig_ManNodeNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                ,0x1e7,"Aig_Man_t *Saig_ManDupInitZero(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Saig_ManDupInitZero( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi( pNew ), pObj->fMarkA );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Saig_ManForEachPo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond( Aig_ObjChild0Copy(pObj), pObj->fMarkA ) );
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p) );
    assert( Aig_ManNodeNum(pNew) == Aig_ManNodeNum(p) );
    return pNew;
}